

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc_normalize.cpp
# Opt level: O2

string_t __thiscall
duckdb::NFCNormalizeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (NFCNormalizeOperator *this,string_t input,Vector *result)

{
  bool bVar1;
  char *pcVar2;
  string_t sVar4;
  undefined8 local_38;
  char *local_30;
  char *pcVar3;
  
  pcVar3 = input.value._0_8_;
  pcVar2 = (char *)((long)&local_38 + 4);
  if (0xc < (uint)this) {
    pcVar2 = pcVar3;
  }
  local_38 = this;
  local_30 = pcVar3;
  bVar1 = IsAscii(pcVar2,(ulong)this & 0xffffffff);
  if (!bVar1) {
    pcVar2 = Utf8Proc::Normalize(pcVar2,(ulong)this & 0xffffffff);
    sVar4 = StringVector::AddString(input.value._8_8_,pcVar2);
    pcVar3 = sVar4.value._8_8_;
    this = sVar4.value._0_8_;
    free(pcVar2);
  }
  sVar4.value.pointer.ptr = pcVar3;
  sVar4.value._0_8_ = this;
  return (string_t)sVar4.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		if (IsAscii(input_data, input_length)) {
			return input;
		}
		auto normalized_str = Utf8Proc::Normalize(input_data, input_length);
		D_ASSERT(normalized_str);
		auto result_str = StringVector::AddString(result, normalized_str);
		free(normalized_str);
		return result_str;
	}